

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# STEPFile.h
# Opt level: O1

Object * Assimp::STEP::ObjectHelper<Assimp::IFC::Schema_2x3::IfcEllipse,_2UL>::Construct
                   (DB *db,LIST *params)

{
  IfcEllipse *in;
  
  in = (IfcEllipse *)operator_new(0x88);
  *(undefined ***)&in->field_0x70 = &PTR__Object_008f50b0;
  *(undefined8 *)&in->field_0x78 = 0;
  *(char **)&in->field_0x80 = "IfcEllipse";
  Assimp::IFC::Schema_2x3::IfcConic::IfcConic((IfcConic *)in,&PTR_construction_vtable_24__009aa250);
  *(undefined8 *)&(in->super_IfcConic).field_0x58 = 0;
  (in->super_IfcConic).super_IfcCurve.super_IfcGeometricRepresentationItem.
  super_IfcRepresentationItem.
  super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRepresentationItem,_0UL>._vptr_ObjectHelper =
       (_func_int **)&PTR__IfcEllipse_009aa170;
  *(undefined ***)&in->field_0x70 = &PTR__IfcEllipse_009aa238;
  *(undefined ***)
   &(in->super_IfcConic).super_IfcCurve.super_IfcGeometricRepresentationItem.
    super_IfcRepresentationItem.
    super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRepresentationItem,_0UL>.field_0x10 =
       &PTR__IfcEllipse_009aa198;
  *(undefined ***)
   &(in->super_IfcConic).super_IfcCurve.super_IfcGeometricRepresentationItem.
    super_IfcRepresentationItem.
    super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRepresentationItem,_0UL>.field_0x20 =
       &PTR__IfcEllipse_009aa1c0;
  *(undefined ***)
   &(in->super_IfcConic).super_IfcCurve.super_IfcGeometricRepresentationItem.field_0x30 =
       &PTR__IfcEllipse_009aa1e8;
  *(undefined ***)&(in->super_IfcConic).field_0x50 = &PTR__IfcEllipse_009aa210;
  GenericFill<Assimp::IFC::Schema_2x3::IfcEllipse>(db,params,in);
  return (Object *)
         ((long)&(in->super_IfcConic).super_IfcCurve.super_IfcGeometricRepresentationItem.
                 super_IfcRepresentationItem.
                 super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRepresentationItem,_0UL>.
                 _vptr_ObjectHelper +
         (long)(in->super_IfcConic).super_IfcCurve.super_IfcGeometricRepresentationItem.
               super_IfcRepresentationItem.
               super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRepresentationItem,_0UL>.
               _vptr_ObjectHelper[0xfffffffffffffffd]);
}

Assistant:

static Object* Construct(const STEP::DB& db, const EXPRESS::LIST& params) {
            // make sure we don't leak if Fill() throws an exception
            std::unique_ptr<TDerived> impl(new TDerived());

            // GenericFill<T> is undefined so we need to have a specialization
            const size_t num_args = GenericFill<TDerived>(db,params,&*impl);
            (void)num_args;

            // the following check is commented because it will always trigger if
            // parts of the entities are generated with dummy wrapper code.
            // This is currently done to reduce the size of the loader
            // code.
            //if (num_args != params.GetSize() && impl->GetClassName() != "NotImplemented") {
            //  DefaultLogger::get()->debug("STEP: not all parameters consumed");
            //}
            return impl.release();
        }